

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckIndent.cxx
# Opt level: O0

bool __thiscall kws::Parser::CheckValidSwitchStatement(Parser *this,uint posSwitch)

{
  char *pcVar1;
  ulong uVar2;
  int in_ESI;
  long in_RDI;
  undefined1 local_1;
  
  pcVar1 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
  if (*pcVar1 == '\n') {
LAB_001a9c36:
    uVar2 = std::__cxx11::string::size();
    if (in_ESI + 6 < uVar2) {
      pcVar1 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
      if (*pcVar1 != ' ') {
        pcVar1 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
        if (*pcVar1 != '(') goto LAB_001a9c9d;
      }
    }
    local_1 = true;
  }
  else {
    pcVar1 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
    if ((*pcVar1 == ' ') || (in_ESI == 1)) goto LAB_001a9c36;
LAB_001a9c9d:
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Parser::CheckValidSwitchStatement(unsigned int posSwitch)
{
  if((m_BufferNoComment[posSwitch-1]!='\n'
     && m_BufferNoComment[posSwitch-1]!=' '
     && posSwitch-1 != 0) ||
     (m_BufferNoComment.size() > posSwitch+6
      && m_BufferNoComment[posSwitch+6] != ' '
      && m_BufferNoComment[posSwitch+6] != '('))
   {
   return false;
   }
  return true;
}